

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::setEnterBounds(SPxSolverBase<double> *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  DataKey *pDVar4;
  int in_stack_00000008;
  int in_stack_0000000c;
  SPxSolverBase<double> *in_stack_00000010;
  SPxId base_id;
  int i;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  SPxColId local_24;
  SPxRowId local_1c;
  DataKey local_14;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = local_c;
    iVar3 = dim((SPxSolverBase<double> *)0x25c87d);
    if (iVar3 <= iVar1) break;
    pDVar4 = &SPxBasisBase<double>::baseId
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc)->super_DataKey;
    local_14 = *pDVar4;
    bVar2 = SPxId::isSPxRowId((SPxId *)&local_14);
    if (bVar2) {
      SPxRowId::SPxRowId(&local_1c,(SPxId *)&local_14);
      SPxLPBase<double>::number
                ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (SPxRowId *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      setEnterBound4Row(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
    }
    else {
      in_stack_ffffffffffffffc4 = local_c;
      SPxColId::SPxColId(&local_24,(SPxId *)&local_14);
      SPxLPBase<double>::number
                ((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (SPxColId *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      setEnterBound4Col(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBounds()
{

   for(int i = 0; i < dim(); ++i)
   {
      SPxId base_id = this->baseId(i);

      if(base_id.isSPxRowId())
         setEnterBound4Row(i, this->number(SPxRowId(base_id)));
      else
         setEnterBound4Col(i, this->number(SPxColId(base_id)));
   }
}